

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O2

void __thiscall
FunctionCallNode::FunctionCallNode
          (FunctionCallNode *this,string *name,
          list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
          *arguments)

{
  (this->super_CallNode).super_ExpressionNode.super_Node.mark_.line = 1;
  (this->super_CallNode).super_ExpressionNode.super_Node.mark_.column = 0;
  (this->super_CallNode).super_ExpressionNode.super_Node._vptr_Node =
       (_func_int **)&PTR__FunctionCallNode_001d0e18;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->arguments_,(_List_node_header *)arguments);
  return;
}

Assistant:

FunctionCallNode(const std::string& name, 
    std::list<std::shared_ptr<ExpressionNode>> arguments):
      name_(name), arguments_(std::move(arguments)) {}